

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_76a6bf::RSTFormatter::Write(RSTFormatter *this,CStringRef s)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  BasicStringRef<char> value;
  
  do {
    do {
      pbVar3 = (byte *)s.data_;
      bVar1 = *pbVar3;
      s.data_ = (char *)(pbVar3 + 1);
    } while (bVar1 == 0x20);
    sVar4 = 0;
    while ((0x20 < bVar1 || ((0x100000401U >> ((ulong)bVar1 & 0x3f) & 1) == 0))) {
      bVar1 = *s.data_;
      s.data_ = s.data_ + 1;
      sVar4 = sVar4 + 1;
    }
    iVar2 = this->pos_in_line_;
    if (0x4e < (long)((((long)iVar2 + 1) - (ulong)((long)iVar2 == 0)) + sVar4)) {
      EndLine(this);
      iVar2 = this->pos_in_line_;
    }
    if (iVar2 == 0) {
      Indent(this);
    }
    else {
      fmt::BasicWriter<char>::operator<<(this->writer_,' ');
      this->pos_in_line_ = this->pos_in_line_ + 1;
    }
    value.size_ = sVar4;
    value.data_ = (char *)pbVar3;
    fmt::BasicWriter<char>::operator<<(this->writer_,value);
    this->pos_in_line_ = this->pos_in_line_ + (int)sVar4;
    bVar1 = ((byte *)s.data_)[-1];
    pbVar3 = (byte *)s.data_ + -1;
    if (bVar1 == 10) {
      EndLine(this);
      bVar1 = *s.data_;
      pbVar3 = (byte *)s.data_;
    }
    s.data_ = (char *)pbVar3;
  } while (bVar1 != 0);
  return;
}

Assistant:

void RSTFormatter::Write(fmt::CStringRef s) {
  enum { MAX_LINE_LENGTH = 78 };
  const char *p = s.c_str();
  for (;;) {
    // Skip leading spaces.
    while (*p == ' ')
      ++p;
    const char *word_start = p;
    while (*p != ' ' && *p != '\n' && *p)
      ++p;
    const char *word_end = p;
    if (pos_in_line_ + (word_end - word_start) +
        (pos_in_line_ == 0 ? 0 : 1) > MAX_LINE_LENGTH) {
      EndLine();  // The word doesn't fit in the current line, start a new one.
    }
    if (pos_in_line_ == 0) {
      Indent();
    } else {
      // Separate words.
      writer_ << ' ';
      ++pos_in_line_;
    }
    std::size_t length = word_end - word_start;
    writer_ << fmt::StringRef(word_start, length);
    pos_in_line_ += static_cast<int>(length);
    if (*p == '\n') {
      EndLine();
      ++p;
    }
    if (!*p) break;
  }
}